

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void fillTensor<unsigned_int>
               (vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                *tensor,uint value)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  pvVar1 = (tensor->
           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(tensor->
                super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 3) * -0x5555555555555555;
    lVar6 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar6].
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar7 = (long)*(pointer *)
                     ((long)&pvVar1[lVar6].
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data + 8) - lVar2;
      if (lVar7 != 0) {
        lVar7 = (lVar7 >> 3) * -0x5555555555555555;
        lVar8 = 0;
        do {
          lVar3 = *(long *)(lVar2 + lVar8 * 0x18);
          lVar5 = *(long *)(lVar2 + 8 + lVar8 * 0x18) - lVar3;
          if (lVar5 != 0) {
            lVar5 = lVar5 >> 2;
            lVar9 = 0;
            do {
              *(uint *)(lVar3 + lVar9 * 4) = value;
              lVar9 = lVar9 + 1;
            } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar4 + (ulong)(lVar4 == 0));
  }
  return;
}

Assistant:

void fillTensor(std::vector<std::vector<std::vector<T> > > &tensor, T value){
    for(int i=0; i<tensor.size(); i++){
        for(int j=0; j<tensor[i].size(); j++){
            for(int k=0; k<tensor[i][j].size(); k++){
                tensor[i][j][k] = value;
            }
        }
    }
}